

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlSBufFinish(xmlSBuf *buf,int *sizeOut,xmlParserCtxtPtr ctxt,char *errMsg)

{
  xmlChar *pxVar1;
  
  if (buf->mem == (xmlChar *)0x0) {
    pxVar1 = (xmlChar *)(*xmlMalloc)(1);
    buf->mem = pxVar1;
    if (pxVar1 == (xmlChar *)0x0) {
      buf->code = XML_ERR_NO_MEMORY;
    }
    else {
      *pxVar1 = '\0';
    }
  }
  else {
    buf->mem[buf->size] = '\0';
  }
  if (buf->code == XML_ERR_OK) {
    if (sizeOut != (int *)0x0) {
      *sizeOut = buf->size;
    }
    pxVar1 = buf->mem;
  }
  else {
    xmlSBufReportError(buf,ctxt,errMsg);
    (*xmlFree)(buf->mem);
    if (sizeOut != (int *)0x0) {
      *sizeOut = 0;
    }
    pxVar1 = (xmlChar *)0x0;
  }
  return pxVar1;
}

Assistant:

static xmlChar *
xmlSBufFinish(xmlSBuf *buf, int *sizeOut, xmlParserCtxtPtr ctxt,
              const char *errMsg) {
    if (buf->mem == NULL) {
        buf->mem = xmlMalloc(1);
        if (buf->mem == NULL) {
            buf->code = XML_ERR_NO_MEMORY;
        } else {
            buf->mem[0] = 0;
        }
    } else {
        buf->mem[buf->size] = 0;
    }

    if (buf->code == XML_ERR_OK) {
        if (sizeOut != NULL)
            *sizeOut = buf->size;
        return(buf->mem);
    }

    xmlSBufReportError(buf, ctxt, errMsg);

    xmlFree(buf->mem);

    if (sizeOut != NULL)
        *sizeOut = 0;
    return(NULL);
}